

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void test_request_permission_callback(ne_core_permission_event *event,void *user_data)

{
  byte bVar1;
  test_table *table;
  void *user_data_local;
  ne_core_permission_event *event_local;
  
  bVar1 = test_validate(event->permission == *(uint64_t *)((long)user_data + 8),0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test/test.cpp"
                        ,0x21d,"TEST_EXPECT(event->permission == table->permission) failed\n");
  *(byte *)((long)user_data + 0x48) = *(byte *)((long)user_data + 0x48) & bVar1;
  bVar1 = test_validate(event->current_state != ne_core_permission_state_prompt,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test/test.cpp"
                        ,0x21e,
                        "TEST_EXPECT(event->current_state != ne_core_permission_state_prompt) failed\n"
                       );
  *(byte *)((long)user_data + 0x48) = *(byte *)((long)user_data + 0x48) & bVar1;
  bVar1 = test_validate(event->previous_state == ne_core_permission_state_prompt,0,
                        "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test/test.cpp"
                        ,0x21f,
                        "TEST_EXPECT(event->previous_state == ne_core_permission_state_prompt) failed\n"
                       );
  *(byte *)((long)user_data + 0x48) = *(byte *)((long)user_data + 0x48) & bVar1;
  if (event->current_state == ne_core_permission_state_granted) {
    if (*(long *)((long)user_data + 0x40) != 0) {
      **(undefined8 **)((long)user_data + 0x40) = 0;
    }
    (*ne_core_query_permission)
              (*(uint64_t **)((long)user_data + 0x40),*(uint64_t *)((long)user_data + 8),
               test_query_permission_granted_callback,user_data);
    if (*(long *)((long)user_data + 0x40) != 0) {
      bVar1 = test_validate(**(long **)((long)user_data + 0x40) == 1,
                            **(uint64_t **)((long)user_data + 0x40),
                            "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test/test.cpp"
                            ,0x229,"TEST_EXPECT_RESULT(NE_CORE_RESULT_SUCCESS) failed\n");
      *(byte *)((long)user_data + 0x48) = *(byte *)((long)user_data + 0x48) & bVar1;
    }
  }
  else {
    bVar1 = test_validate(event->current_state == ne_core_permission_state_denied,0,
                          "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test/test.cpp"
                          ,0x22d,
                          "TEST_EXPECT(event->current_state == ne_core_permission_state_denied) failed\n"
                         );
    *(byte *)((long)user_data + 0x48) = *(byte *)((long)user_data + 0x48) & bVar1;
    if (*(long *)((long)user_data + 0x40) != 0) {
      **(undefined8 **)((long)user_data + 0x40) = 0;
    }
    (*ne_core_query_permission)
              (*(uint64_t **)((long)user_data + 0x40),*(uint64_t *)((long)user_data + 8),
               test_query_permission_denied_callback,user_data);
    if (*(long *)((long)user_data + 0x40) != 0) {
      bVar1 = test_validate(**(long **)((long)user_data + 0x40) == 1,
                            **(uint64_t **)((long)user_data + 0x40),
                            "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test/test.cpp"
                            ,0x235,"TEST_EXPECT_RESULT(NE_CORE_RESULT_SUCCESS) failed\n");
      *(byte *)((long)user_data + 0x48) = *(byte *)((long)user_data + 0x48) & bVar1;
    }
  }
  return;
}

Assistant:

static void test_request_permission_callback(
    const ne_core_permission_event *event, const void *user_data)
{
  auto table = static_cast<test_table *>(const_cast<void *>(user_data));
  TEST_EXPECT(event->permission == table->permission);
  TEST_EXPECT(event->current_state != ne_core_permission_state_prompt);
  TEST_EXPECT(event->previous_state == ne_core_permission_state_prompt);

  if (event->current_state == ne_core_permission_state_granted)
  {
    // We SHOULD have permission.
    TEST_CLEAR_RESULT();
    ne_core_query_permission(table->result,
                             table->permission,
                             &test_query_permission_granted_callback,
                             table);
    TEST_EXPECT_RESULT(NE_CORE_RESULT_SUCCESS);
  }
  else
  {
    TEST_EXPECT(event->current_state == ne_core_permission_state_denied);

    // We SHOULD NOT have permission.
    TEST_CLEAR_RESULT();
    ne_core_query_permission(table->result,
                             table->permission,
                             &test_query_permission_denied_callback,
                             table);
    TEST_EXPECT_RESULT(NE_CORE_RESULT_SUCCESS);
  }
}